

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

_Bool file_stdio_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  int errnum;
  int iVar1;
  USERDATA *pUVar2;
  int *piVar3;
  
  pUVar2 = get_userdata(f);
  iVar1 = fseeko((FILE *)pUVar2->fp,offset,whence);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    errnum = *piVar3;
    pUVar2->errnum = errnum;
    al_set_errno(errnum);
  }
  return iVar1 != -1;
}

Assistant:

static bool file_stdio_fseek(ALLEGRO_FILE *f, int64_t offset,
   int whence)
{
   USERDATA *userdata = get_userdata(f);
   int rc;

   switch (whence) {
      case ALLEGRO_SEEK_SET: whence = SEEK_SET; break;
      case ALLEGRO_SEEK_CUR: whence = SEEK_CUR; break;
      case ALLEGRO_SEEK_END: whence = SEEK_END; break;
   }

#if defined(ALLEGRO_HAVE_FSEEKO)
   rc = fseeko(userdata->fp, offset, whence);
#elif defined(ALLEGRO_HAVE_FSEEKI64)
   rc = _fseeki64(userdata->fp, offset, whence);
#else
   rc = fseek(userdata->fp, offset, whence);
#endif

   if (rc == -1) {
      userdata->errnum = errno;
      al_set_errno(errno);
      return false;
   }

   return true;
}